

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O3

void __thiscall Fl_Text_Buffer::remove_(Fl_Text_Buffer *this,int start,int end)

{
  int iVar1;
  char *pcVar2;
  int pos;
  
  if (this->mCanUndo != '\0') {
    if ((undowidget == this) && (undocut != 0 && undoat == end)) {
      undobuffersize((end - start) + undocut + 1);
      iVar1 = undocut;
      memmove(undobuffer + ((long)end - (long)start),undobuffer,(long)undocut);
      undocut = iVar1 + (end - start);
    }
    else {
      undocut = end - start;
      undobuffersize(undocut);
    }
    undoinsert = 0;
    undoyankcut = 0;
    undowidget = this;
    undoat = start;
  }
  pcVar2 = undobuffer;
  iVar1 = this->mGapStart;
  if (iVar1 < start) {
    pos = start;
    if (this->mCanUndo != '\0') {
      memcpy(undobuffer,this->mBuf + (long)start + ((long)this->mGapEnd - (long)iVar1),
             (long)(end - start));
    }
  }
  else {
    if (iVar1 <= end) {
      if (this->mCanUndo != '\0') {
        memcpy(undobuffer,this->mBuf + start,(long)(iVar1 - start));
        memcpy(pcVar2 + (iVar1 - start),this->mBuf + this->mGapEnd,(long)(end - iVar1));
      }
      goto LAB_001ceeb3;
    }
    pos = end;
    if (this->mCanUndo != '\0') {
      memcpy(undobuffer,this->mBuf + start,(long)(end - start));
    }
  }
  move_gap(this,pos);
LAB_001ceeb3:
  this->mGapEnd = this->mGapEnd + (end - this->mGapStart);
  this->mGapStart = start;
  this->mLength = this->mLength - (end - start);
  update_selections(this,start,end - start,0);
  return;
}

Assistant:

void Fl_Text_Buffer::remove_(int start, int end)
{
  /* if the gap is not contiguous to the area to remove, move it there */
  
  if (mCanUndo) {
    if (undowidget == this && undoat == end && undocut) {
      undobuffersize(undocut + end - start + 1);
      memmove(undobuffer + end - start, undobuffer, undocut);
      undocut += end - start;
    } else {
      undocut = end - start;
      undobuffersize(undocut);
    }
    undoat = start;
    undoinsert = 0;
    undoyankcut = 0;
    undowidget = this;
  }
  
  if (start > mGapStart) {
    if (mCanUndo)
      memcpy(undobuffer, mBuf + (mGapEnd - mGapStart) + start,
	     end - start);
    move_gap(start);
  } else if (end < mGapStart) {
    if (mCanUndo)
      memcpy(undobuffer, mBuf + start, end - start);
    move_gap(end);
  } else {
    int prelen = mGapStart - start;
    if (mCanUndo) {
      memcpy(undobuffer, mBuf + start, prelen);
      memcpy(undobuffer + prelen, mBuf + mGapEnd, end - start - prelen);
    }
  }
  
  /* expand the gap to encompass the deleted characters */
  mGapEnd += end - mGapStart;
  mGapStart -= mGapStart - start;
  
  /* update the length */
  mLength -= end - start;
  
  /* fix up any selections which might be affected by the change */
  update_selections(start, end - start, 0);
}